

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
~DrawTestCase(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  ~DrawTestCase(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

DrawTestCase<T>::~DrawTestCase	(void)
{
}